

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMember::IfcStructuralSurfaceMember
          (IfcStructuralSurfaceMember *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralSurfaceMember *this_local;
  
  IfcStructuralMember::IfcStructuralMember(&this->super_IfcStructuralMember,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMember,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMember,_2UL> *)
             &(this->super_IfcStructuralMember).super_IfcStructuralItem.field_0x120,vtt + 0x28);
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
              super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcStructuralMember).super_IfcStructuralItem.
                                super_IfcProduct.super_IfcObject + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0x88 = vtt[0x2b];
  (this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.
             super_IfcObject.field_0xd0 = vtt[0x2d];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x100
       = vtt[0x2e];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.super_IfcProduct.field_0x110
       = vtt[0x2f];
  *(void **)&(this->super_IfcStructuralMember).super_IfcStructuralItem.field_0x120 = vtt[0x30];
  std::__cxx11::string::string((string *)&(this->super_IfcStructuralMember).field_0x130);
  STEP::Maybe<double>::Maybe(&this->Thickness);
  return;
}

Assistant:

IfcStructuralSurfaceMember() : Object("IfcStructuralSurfaceMember") {}